

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O3

tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *
generate_list<trng::mrg3s>
          (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,mrg3s *r1,mrg3s *r2,long N,long skip1,long skip2)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long i;
  long lVar7;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_58;
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
  *local_40;
  long local_38;
  
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_40 = (_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              *)__return_storage_ptr__;
  local_38 = N;
  if (0 < N) {
    std::vector<int,_std::allocator<int>_>::reserve(&local_58,N);
    std::vector<int,_std::allocator<int>_>::reserve(&local_78,N);
    lVar7 = 0;
    do {
      iVar4 = (r1->S).r[0];
      iVar6 = (r1->S).r[1];
      uVar2 = (long)(r1->S).r[2] * (long)(r1->P).a[2] +
              (long)(r1->P).a[1] * (long)iVar6 + (long)(r1->P).a[0] * (long)iVar4;
      (r1->S).r[2] = iVar6;
      (r1->S).r[1] = iVar4;
      uVar2 = (uVar2 >> 0x1f) * -0x7fffadb3 + uVar2;
      uVar2 = (uVar2 >> 0x1f) * -0x7fffadb3 + uVar2;
      iVar4 = (int)uVar2;
      local_7c = iVar4 + -0x7fffadb3;
      if (uVar2 < 0x7fffadb3) {
        local_7c = iVar4;
      }
      (r1->S).r[0] = local_7c;
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_7c);
      }
      else {
        *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_7c;
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar4 = (r2->S).r[0];
      iVar6 = (r2->S).r[1];
      uVar2 = (long)(r2->S).r[2] * (long)(r2->P).a[2] +
              (long)(r2->P).a[1] * (long)iVar6 + (long)(r2->P).a[0] * (long)iVar4;
      (r2->S).r[2] = iVar6;
      (r2->S).r[1] = iVar4;
      uVar2 = (uVar2 >> 0x1f) * -0x7fffadb3 + uVar2;
      uVar2 = (uVar2 >> 0x1f) * -0x7fffadb3 + uVar2;
      iVar4 = (int)uVar2;
      local_7c = iVar4 + -0x7fffadb3;
      if (uVar2 < 0x7fffadb3) {
        local_7c = iVar4;
      }
      (r2->S).r[0] = local_7c;
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_7c);
      }
      else {
        *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_7c;
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (0 < skip1) {
        lVar3 = skip1;
        iVar4 = (r1->S).r[2];
        iVar6 = (r1->S).r[0];
        iVar5 = (r1->S).r[1];
        do {
          iVar1 = iVar5;
          iVar5 = iVar6;
          uVar2 = (long)iVar4 * (long)(r1->P).a[2] +
                  (long)iVar1 * (long)(r1->P).a[1] + (long)iVar5 * (long)(r1->P).a[0];
          uVar2 = (uVar2 >> 0x1f) * -0x7fffadb3 + uVar2;
          uVar2 = (uVar2 >> 0x1f) * -0x7fffadb3 + uVar2;
          iVar4 = (int)uVar2;
          iVar6 = iVar4 + -0x7fffadb3;
          if (uVar2 < 0x7fffadb3) {
            iVar6 = iVar4;
          }
          lVar3 = lVar3 + -1;
          iVar4 = iVar1;
        } while (lVar3 != 0);
        (r1->S).r[2] = iVar1;
        (r1->S).r[1] = iVar5;
        (r1->S).r[0] = iVar6;
      }
      if (0 < skip2) {
        lVar3 = skip2;
        iVar4 = (r2->S).r[2];
        iVar6 = (r2->S).r[0];
        iVar5 = (r2->S).r[1];
        do {
          iVar1 = iVar5;
          iVar5 = iVar6;
          uVar2 = (long)iVar4 * (long)(r2->P).a[2] +
                  (long)iVar1 * (long)(r2->P).a[1] + (long)iVar5 * (long)(r2->P).a[0];
          uVar2 = (uVar2 >> 0x1f) * -0x7fffadb3 + uVar2;
          uVar2 = (uVar2 >> 0x1f) * -0x7fffadb3 + uVar2;
          iVar4 = (int)uVar2;
          iVar6 = iVar4 + -0x7fffadb3;
          if (uVar2 < 0x7fffadb3) {
            iVar6 = iVar4;
          }
          lVar3 = lVar3 + -1;
          iVar4 = iVar1;
        } while (lVar3 != 0);
        (r2->S).r[2] = iVar1;
        (r2->S).r[1] = iVar5;
        (r2->S).r[0] = iVar6;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != local_38);
  }
  std::_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>::
  _Tuple_impl<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,void>
            (local_40,&local_58,&local_78);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *)
         local_40;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}